

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

wchar_t archive_acl_parse_l(archive_acl *acl,char *text,wchar_t default_type,archive_string_conv *sc
                           )

{
  char cVar1;
  int iVar2;
  archive_acl *acl_00;
  byte bVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  ulong uVar6;
  byte *pbVar7;
  archive_acl_entry *paVar8;
  ulong uVar9;
  wchar_t id;
  int iVar10;
  byte *pbVar11;
  int *piVar12;
  char *pcVar13;
  byte *pbVar14;
  wchar_t permset;
  anon_struct_16_2_267fbce2 field [4];
  wchar_t local_b4;
  byte *local_b0;
  byte *local_a8;
  wchar_t local_a0;
  wchar_t local_9c;
  wchar_t local_98;
  wchar_t local_94;
  undefined8 local_90;
  int *local_88 [9];
  archive_string_conv *local_40;
  archive_acl *local_38;
  
  wVar4 = L'\0';
  if ((text != (char *)0x0) && (*text != '\0')) {
    local_90 = 0;
    local_a0 = default_type;
    local_40 = sc;
    local_38 = acl;
    do {
      uVar6 = 0;
      do {
        while ((uVar9 = uVar6, uVar6 = (ulong)(byte)*text, pbVar7 = (byte *)text, uVar6 < 0x21 &&
               ((0x100000600U >> (uVar6 & 0x3f) & 1) != 0))) {
          text = (char *)((byte *)text + 1);
          uVar6 = uVar9;
        }
        while ((bVar3 = (byte)uVar6, 0x3a < bVar3 ||
               (pbVar14 = pbVar7, (0x400100000000401U >> (uVar6 & 0x3f) & 1) == 0))) {
          uVar6 = (ulong)pbVar7[1];
          pbVar7 = pbVar7 + 1;
        }
        do {
          pbVar11 = pbVar14;
          if (0x20 < (ulong)pbVar11[-1]) break;
          pbVar14 = pbVar11 + -1;
        } while ((0x100000600U >> ((ulong)pbVar11[-1] & 0x3f) & 1) != 0);
        if (uVar9 < 4) {
          local_88[uVar9 * 2] = (int *)text;
          local_88[uVar9 * 2 + 1] = (int *)pbVar11;
        }
        text = (char *)(pbVar7 + (bVar3 != 0));
        uVar6 = uVar9 + 1;
      } while (bVar3 == 0x3a);
      text = (char *)(pbVar7 + (bVar3 != 0));
      if (uVar9 < 3) {
        memset(local_88 + uVar9 * 2 + 2,0,uVar9 * -0x10 + 0x30);
      }
      if (local_88[2] < local_88[3]) {
        id = L'\0';
        pbVar7 = (byte *)local_88[2];
        do {
          bVar3 = *pbVar7;
          if ((byte)(bVar3 - 0x3a) < 0xf6) goto LAB_0019e222;
          wVar4 = L'\x7fffffff';
          if ((id < L'\x0ccccccd') && ((id != L'\x0ccccccc' || (bVar3 < 0x38)))) {
            wVar4 = (uint)bVar3 + id * 10 + L'\xffffffd0';
          }
          id = wVar4;
          pbVar7 = pbVar7 + 1;
        } while (pbVar7 != (byte *)local_88[3]);
      }
      else {
LAB_0019e222:
        id = L'\xffffffff';
      }
      if (2 < uVar9 && id == L'\xffffffff') {
        if (local_88[6] < local_88[7]) {
          pbVar7 = (byte *)local_88[6];
          wVar4 = L'\0';
          do {
            bVar3 = *pbVar7;
            if ((byte)(bVar3 - 0x3a) < 0xf6) goto LAB_0019e284;
            id = L'\x7fffffff';
            if ((wVar4 < L'\x0ccccccd') && ((wVar4 != L'\x0ccccccc' || (bVar3 < 0x38)))) {
              id = (uint)bVar3 + wVar4 * 10 + L'\xffffffd0';
            }
            pbVar7 = pbVar7 + 1;
            wVar4 = id;
          } while (pbVar7 != (byte *)local_88[7]);
        }
        else {
LAB_0019e284:
          id = L'\xffffffff';
        }
      }
      local_94 = local_a0;
      if ((7 < (long)local_88[1] - (long)local_88[0]) &&
         (*(int *)((long)local_88[0] + 3) == 0x746c7561 && *local_88[0] == 0x61666564)) {
        local_88[0] = (int *)((long)local_88[0] + 7);
        local_94 = L'Ȁ';
      }
      wVar4 = L'\xffffffec';
      if (local_88[0] == local_88[1]) {
        return L'\xffffffec';
      }
      cVar1 = (char)*local_88[0];
      iVar10 = (int)uVar9;
      switch((byte)(cVar1 + 0x99U) >> 1 | (cVar1 + 0x99U) * -0x80) {
      case 0:
switchD_0019e2f6_caseD_0:
        piVar12 = (int *)((long)local_88[0] + 1);
        pcVar13 = "group";
        do {
          pcVar13 = pcVar13 + 1;
          if (local_88[1] <= piVar12) break;
          iVar2 = *piVar12;
          piVar12 = (int *)((long)piVar12 + 1);
        } while ((char)iVar2 == *pcVar13);
        if (local_88[1] <= piVar12) {
          local_b0 = (byte *)local_88[2];
          local_a8 = (byte *)local_88[3];
          wVar4 = ismode((char *)local_88[4],(char *)local_88[5],&local_b4);
          if (wVar4 == L'\0') {
            return L'\xffffffec';
          }
          if ((local_b0 < local_a8) || (id != L'\xffffffff')) {
            local_98 = L'✓';
            goto LAB_0019e530;
          }
          local_98 = L'✔';
          goto LAB_0019e51e;
        }
        if (cVar1 != 'm') {
          if (cVar1 != 'o') {
            return L'\xffffffec';
          }
          goto switchD_0019e2f6_caseD_4;
        }
      case 3:
switchD_0019e2f6_caseD_3:
        piVar12 = (int *)((long)local_88[0] + 1);
        pcVar13 = "mask";
        do {
          pcVar13 = pcVar13 + 1;
          if (local_88[1] <= piVar12) break;
          iVar2 = *piVar12;
          piVar12 = (int *)((long)piVar12 + 1);
        } while ((char)iVar2 == *pcVar13);
        if (piVar12 < local_88[1]) {
          return L'\xffffffec';
        }
        if (iVar10 == 2) {
          if (local_88[2] != local_88[3]) {
            return L'\xffffffec';
          }
          pbVar7 = (byte *)local_88[5];
          pbVar14 = (byte *)local_88[4];
          if (local_88[5] <= local_88[4]) {
            return L'\xffffffec';
          }
        }
        else {
          if (iVar10 != 1) {
            return L'\xffffffec';
          }
          pbVar7 = (byte *)local_88[3];
          pbVar14 = (byte *)local_88[2];
          if (local_88[3] <= local_88[2]) {
            return L'\xffffffec';
          }
        }
        wVar4 = ismode((char *)pbVar14,(char *)pbVar7,&local_b4);
        if (wVar4 == L'\0') {
          return L'\xffffffec';
        }
        local_98 = L'✕';
LAB_0019e51e:
        local_a8 = (byte *)0x0;
        local_b0 = (byte *)0x0;
LAB_0019e530:
        acl_00 = local_38;
        wVar4 = local_94;
        local_9c = local_b4;
        wVar5 = acl_special(local_38,local_94,local_b4,local_98);
        if (wVar5 != L'\0') {
          paVar8 = acl_new_entry(acl_00,wVar4,local_9c,local_98,id);
          if (paVar8 == (archive_acl_entry *)0x0) {
            return L'\xffffffe7';
          }
          if (((local_b0 == (byte *)0x0) || (local_a8 == local_b0)) || (*local_b0 == 0)) {
            archive_mstring_clean(&paVar8->name);
          }
          else {
            wVar4 = archive_mstring_copy_mbs_len_l
                              (&paVar8->name,(char *)local_b0,(long)local_a8 - (long)local_b0,
                               local_40);
            if (wVar4 != L'\0') {
              piVar12 = __errno_location();
              local_90 = 0xffffffec;
              if (*piVar12 == 0xc) {
                return L'\xffffffe2';
              }
            }
          }
        }
        if (*text == 0) {
          return (wchar_t)local_90;
        }
        break;
      default:
        goto switchD_0019e2f6_caseD_1;
      case 4:
switchD_0019e2f6_caseD_4:
        piVar12 = (int *)((long)local_88[0] + 1);
        pcVar13 = "other";
        do {
          pcVar13 = pcVar13 + 1;
          if (local_88[1] <= piVar12) break;
          iVar2 = *piVar12;
          piVar12 = (int *)((long)piVar12 + 1);
        } while ((char)iVar2 == *pcVar13);
        if (piVar12 < local_88[1]) {
          if (cVar1 != 'm') {
            return L'\xffffffec';
          }
          goto switchD_0019e2f6_caseD_3;
        }
        if (iVar10 == 2) {
          if (local_88[2] != local_88[3]) {
            return L'\xffffffec';
          }
          pbVar7 = (byte *)local_88[5];
          pbVar14 = (byte *)local_88[4];
          if (local_88[5] <= local_88[4]) {
            return L'\xffffffec';
          }
        }
        else {
          if (iVar10 != 1) {
            return L'\xffffffec';
          }
          pbVar7 = (byte *)local_88[3];
          pbVar14 = (byte *)local_88[2];
          if (local_88[3] <= local_88[2]) {
            return L'\xffffffec';
          }
        }
        wVar4 = ismode((char *)pbVar14,(char *)pbVar7,&local_b4);
        if (wVar4 == L'\0') {
          return L'\xffffffec';
        }
        local_98 = L'✖';
        goto LAB_0019e51e;
      case 7:
        piVar12 = (int *)((long)local_88[0] + 1);
        pcVar13 = "user";
        do {
          pcVar13 = pcVar13 + 1;
          if (local_88[1] <= piVar12) break;
          iVar2 = *piVar12;
          piVar12 = (int *)((long)piVar12 + 1);
        } while ((char)iVar2 == *pcVar13);
        if (piVar12 < local_88[1]) {
          if (cVar1 == 'o') goto switchD_0019e2f6_caseD_4;
          if (cVar1 == 'm') goto switchD_0019e2f6_caseD_3;
          if (cVar1 == 'g') goto switchD_0019e2f6_caseD_0;
        }
        else {
          local_b0 = (byte *)local_88[2];
          local_a8 = (byte *)local_88[3];
          wVar5 = ismode((char *)local_88[4],(char *)local_88[5],&local_b4);
          if (wVar5 != L'\0') {
            if ((local_a8 <= local_b0) && (id == L'\xffffffff')) {
              local_98 = L'✒';
              goto LAB_0019e51e;
            }
            local_98 = L'✑';
            goto LAB_0019e530;
          }
        }
        goto switchD_0019e2f6_caseD_1;
      }
    } while( true );
  }
switchD_0019e2f6_caseD_1:
  return wVar4;
}

Assistant:

int
archive_acl_parse_l(struct archive_acl *acl,
    const char *text, int default_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[4], name;

	int fields, n, r, ret = ARCHIVE_OK;
	int type, tag, permset, id;
	char sep;

	while (text != NULL  &&  *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &start, &end, &sep);
			if (fields < 4) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < 4; ++n)
			field[n].start = field[n].end = NULL;

		/* Check for a numeric ID in field 1 or 3. */
		id = -1;
		isint(field[1].start, field[1].end, &id);
		/* Field 3 is optional. */
		if (id == -1 && fields > 3)
			isint(field[3].start, field[3].end, &id);

		/*
		 * Solaris extension:  "defaultuser::rwx" is the
		 * default ACL corresponding to "user::rwx", etc.
		 */
		if (field[0].end - field[0].start > 7
		    && memcmp(field[0].start, "default", 7) == 0) {
			type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
			field[0].start += 7;
		} else
			type = default_type;

		name.start = name.end = NULL;
		if (prefix_c(field[0].start, field[0].end, "user")) {
			if (!ismode(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_USER;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
		} else if (prefix_c(field[0].start, field[0].end, "group")) {
			if (!ismode(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_GROUP;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
		} else if (prefix_c(field[0].start, field[0].end, "other")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "other:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "other::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_OTHER;
		} else if (prefix_c(field[0].start, field[0].end, "mask")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "mask:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "mask::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_MASK;
		} else
			return (ARCHIVE_WARN);

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
	}
	return (ret);
}